

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

LogMessage * __thiscall
google::protobuf::internal::LogMessage::operator<<(LogMessage *this,Status *status)

{
  LogMessage *in_RDI;
  Status *in_stack_00000028;
  string local_30 [48];
  
  util::Status::ToString_abi_cxx11_(in_stack_00000028);
  std::__cxx11::string::operator+=((string *)&in_RDI->message_,local_30);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

LogMessage& LogMessage::operator<<(const util::Status& status) {
  message_ += status.ToString();
  return *this;
}